

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O2

void __thiscall
SuffixTree::GeneralizedSuffixTree::DumpCommonStringsToFile
          (GeneralizedSuffixTree *this,string *filename)

{
  uint uVar1;
  FILE *__stream;
  ulong uVar2;
  __node_base *p_Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  ulong uVar4;
  Node *pNVar5;
  ulong uVar6;
  uint uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  vector<std::pair<SuffixTree::Node_*,_unsigned_int>,_std::allocator<std::pair<SuffixTree::Node_*,_unsigned_int>_>_>
  *local_70;
  undefined1 local_68 [8];
  string ans;
  uint local_34;
  
  puts("Finding common substrings...");
  local_68 = (undefined1  [8])0x0;
  std::vector<SuffixTree::Node_*,_std::allocator<SuffixTree::Node_*>_>::resize
            (&this->previous_suffixes,
             (long)(this->strings).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->strings).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(value_type *)local_68);
  ProcessLCAQueries(this,this->root);
  CalculateNumLeavesNumLCA(this,this->root);
  local_70 = &this->answers;
  local_68 = (undefined1  [8])0x0;
  ans._M_dataplus._M_p = (pointer)((ulong)ans._M_dataplus._M_p._4_4_ << 0x20);
  std::
  vector<std::pair<SuffixTree::Node_*,_unsigned_int>,_std::allocator<std::pair<SuffixTree::Node_*,_unsigned_int>_>_>
  ::resize(local_70,(long)(this->strings).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->strings).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5,(value_type *)local_68);
  FindAnswers(this,this->root,0);
  puts("Common substrings were found");
  __stream = fopen((filename->_M_dataplus)._M_p,"w");
  if (__stream == (FILE *)0x0) {
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,"Can not open file: ",(allocator<char> *)&local_b0);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   filename);
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  local_68 = (undefined1  [8])&ans._M_string_length;
  ans._M_dataplus._M_p = (pointer)0x0;
  ans._M_string_length._0_1_ = 0;
  uVar6 = (ulong)((long)(this->strings).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->strings).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5;
  local_34 = 0;
  ans.field_2._8_8_ = this;
  do {
    uVar7 = (int)uVar6 - 1;
    if (uVar7 == 0) {
      fclose(__stream);
      puts("\rSubstrings were written successfully");
      std::__cxx11::string::~string((string *)local_68);
      return;
    }
    uVar2 = *(long *)(ans.field_2._8_8_ + 8) - *(long *)ans.field_2._8_8_ >> 5;
    uVar4 = (ulong)uVar7;
    printf("\rWriting substrings to file: %.2f %%",
           (double)(((float)(uVar2 - uVar4) * 100.0) / (float)uVar2));
    fprintf(__stream,"%u common substrings: ",uVar6 & 0xffffffff);
    uVar1 = *(uint *)(*(long *)(ans.field_2._8_8_ + 0x30) + 8 + uVar4 * 0x10);
    if (local_34 < uVar1) {
      ans._M_dataplus._M_p = (pointer)0x0;
      *(char *)local_68 = '\0';
      pNVar5 = (Node *)((local_70->
                        super__Vector_base<std::pair<SuffixTree::Node_*,_unsigned_int>,_std::allocator<std::pair<SuffixTree::Node_*,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar4);
LAB_00106116:
      pNVar5 = pNVar5->parent;
      local_34 = uVar1;
      if (pNVar5->parent != (Node *)0x0) {
        p_Var3 = (__node_base *)((long)&(pNVar5->parent->edges)._M_h + 0x10);
        do {
          p_Var3 = p_Var3->_M_nxt;
          if (p_Var3 == (__node_base *)0x0) goto LAB_00106116;
        } while (*(Node **)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor != pNVar5);
        std::__cxx11::string::substr
                  ((ulong)&local_90,
                   (ulong)(uint)*(size_t *)(p_Var3 + 3) * 0x20 + *(long *)ans.field_2._8_8_);
        std::operator+(&local_b0,&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                      );
        std::__cxx11::string::operator=((string *)local_68,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        goto LAB_00106116;
      }
    }
    if (ans._M_dataplus._M_p == (pointer)0x0) {
      fwrite("<Empty string>\n",0xf,1,__stream);
    }
    else {
      fprintf(__stream,"%s\n",local_68);
    }
    uVar6 = (ulong)uVar7;
  } while( true );
}

Assistant:

void GeneralizedSuffixTree::DumpCommonStringsToFile (std::string filename)
{
    printf ("Finding common substrings...\n");
    // process lca_queries
    previous_suffixes.resize (strings.size(), nullptr);
    ProcessLCAQueries (root);
    // calculate number of leaves and least common ancestors
    CalculateNumLeavesNumLCA (root);
    // find answers for all numbers of substrings
    answers.resize (strings.size(), std::pair<Node *, uint> (nullptr, 0));
    FindAnswers (root, 0);
    printf ("Common substrings were found\n");
    // write to file
    FILE *file = fopen (filename.c_str(), "w");
    if (!file)
        throw std::string ("Can not open file: ") + filename;
    std::string ans;
    uint cur_max = 0;
    for (uint i = strings.size() - 1; i > 0; --i)
    {
        printf ("\rWriting substrings to file: %.2f %%", (strings.size() - i) * 100.0f / strings.size());
        fprintf (file, "%u common substrings: ", i + 1);
        if (answers[i].second > cur_max)
        {
            cur_max = answers[i].second;
            ans.clear();
            Node *cur_node = answers[i].first;
            while (cur_node->parent)
            {
                for (const auto &edge_pair : cur_node->parent->edges)
                    if (edge_pair.second.node == cur_node)
                    {
                        ans = strings[edge_pair.second.string_number].substr (edge_pair.second.start,
                                edge_pair.second.length) + ans;
                        break;
                    }
                cur_node  = cur_node->parent;
            }
        }
        if (ans.size())
            fprintf (file, "%s\n", ans.c_str());
        else
            fprintf (file, "<Empty string>\n");
    }
    fclose (file);
    printf ("\rSubstrings were written successfully\n");
}